

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_lite.h
# Opt level: O3

void __thiscall
google::protobuf::internal::InternalMetadata::DeleteOutOfLineHelper<std::__cxx11::string>
          (InternalMetadata *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  
  puVar1 = (undefined8 *)(this->ptr_ & 0xfffffffffffffffc);
  puVar2 = puVar1;
  if ((this->ptr_ & 1U) != 0) {
    puVar2 = (undefined8 *)*puVar1;
  }
  if (puVar2 != (undefined8 *)0x0) {
    return;
  }
  if (puVar1 != (undefined8 *)0x0) {
    if ((long *)puVar1[1] != puVar1 + 3) {
      operator_delete((long *)puVar1[1],puVar1[3] + 1);
    }
  }
  operator_delete(puVar1,0x28);
  return;
}

Assistant:

PROTOBUF_ALWAYS_INLINE bool HasUnknownFieldsTag() const {
    return ptr_ & kUnknownFieldsTagMask;
  }